

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aperture_solver.cpp
# Opt level: O2

vector<imrt::Volume,_std::allocator<imrt::Volume>_> *
createVolumes(vector<imrt::Volume,_std::allocator<imrt::Volume>_> *__return_storage_ptr__,
             string *organ_filename,Collimator *collimator)

{
  ostream *poVar1;
  long lVar2;
  ulong uVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  organ_files;
  string line;
  string local_298;
  Volume local_278;
  ifstream organ_file;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&organ_file,(organ_filename->_M_dataplus)._M_p,_S_in);
  organ_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  organ_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  organ_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  if ((abStack_218[*(long *)(_organ_file + -0x18)] & 5) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"ERROR: unable to open instance file: ");
    poVar1 = std::operator<<(poVar1,(string *)organ_filename);
    std::operator<<(poVar1,", stopping! \n");
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"##Reading volume files.");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&organ_file,(string *)&line);
  while ((abStack_218[*(long *)(_organ_file + -0x18)] & 5) == 0) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&organ_file,(string *)&line);
    if (line._M_string_length != 0) {
      poVar1 = std::operator<<((ostream *)&std::cout,"##  ");
      poVar1 = std::operator<<(poVar1,(string *)&line);
      std::endl<char,std::char_traits<char>>(poVar1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&organ_files,&line);
    }
  }
  std::ifstream::close();
  poVar1 = std::operator<<((ostream *)&std::cout,"##  Read ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," files");
  std::endl<char,std::char_traits<char>>(poVar1);
  lVar2 = 0;
  for (uVar3 = 0;
      uVar3 < (ulong)((long)organ_files.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)organ_files.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar3 = uVar3 + 1) {
    std::__cxx11::string::string
              ((string *)&local_298,
               (string *)
               ((long)&((organ_files.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar2));
    imrt::Volume::Volume(&local_278,collimator,&local_298);
    std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::emplace_back<imrt::Volume>
              (__return_storage_ptr__,&local_278);
    std::
    _Rb_tree<int,_std::pair<const_int,_maths::Matrix>,_std::_Select1st<std::pair<const_int,_maths::Matrix>_>,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
    ::~_Rb_tree(&local_278.D._M_t);
    std::__cxx11::string::~string((string *)&local_298);
    lVar2 = lVar2 + 0x20;
  }
  std::__cxx11::string::~string((string *)&line);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&organ_files);
  std::ifstream::~ifstream(&organ_file);
  return __return_storage_ptr__;
}

Assistant:

vector<Volume> createVolumes (string organ_filename, Collimator& collimator){
  ifstream organ_file(organ_filename.c_str(), ios::in);
  vector<string> organ_files;
  vector<Volume> volumes;
  string line;

  if (! organ_file)
    cerr << "ERROR: unable to open instance file: " << organ_filename << ", stopping! \n";

  cout << "##Reading volume files." << endl;
  getline(organ_file, line);
  while (organ_file) {
    getline(organ_file, line);
    if (line.empty()) continue;
    cout << "##  " << line << endl;
    //Assuming one data point
    organ_files.push_back(line);
  }
  organ_file.close();
  cout << "##  Read " << organ_files.size() << " files"<< endl;

  for (int i=0; i<organ_files.size(); i++)
    volumes.push_back(Volume(collimator, organ_files[i]));

  return(volumes);
}